

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::SAT(SAT *this)

{
  duration<long,_std::ratio<1L,_1000L>_> dVar1;
  _func_int **pp_Var2;
  Branching *in_RDI;
  undefined8 in_stack_fffffffffffffee8;
  uint uVar3;
  vec<vec<Lit>_> *in_stack_fffffffffffffef0;
  vec<double> *this_00;
  undefined8 in_stack_fffffffffffffef8;
  uint _sz;
  vec<IntVar_*> *this_01;
  vec<int> *in_stack_ffffffffffffff00;
  Heap<SAT::VarOrderLt> *this_02;
  SAT *this_03;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  vec<char> *this_04;
  Lit p;
  vec<Clause_*> *this_05;
  int n;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffffa8;
  ChannelInfo in_stack_ffffffffffffffb0;
  Reason local_40;
  Lit local_34;
  ChannelInfo local_30;
  double local_28;
  VarOrderLt local_20;
  undefined4 local_18;
  
  _sz = (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  Branching::Branching(in_RDI);
  in_RDI->_vptr_Branching = (_func_int **)&PTR_finished_0031f868;
  LitSort::LitSort((LitSort *)(in_RDI + 1),(vec<int> *)(in_RDI + 0xe));
  vec<Clause_*>::vec((vec<Clause_*> *)(in_RDI + 2));
  this_05 = (vec<Clause_*> *)(in_RDI + 4);
  vec<Clause_*>::vec(this_05);
  n = (int)((ulong)this_05 >> 0x20);
  vec<ChannelInfo>::vec((vec<ChannelInfo> *)(in_RDI + 6));
  vec<vec<WatchElem>_>::vec((vec<vec<WatchElem>_> *)(in_RDI + 8));
  vec<signed_char>::vec((vec<signed_char> *)(in_RDI + 10));
  vec<Reason>::vec((vec<Reason> *)(in_RDI + 0xc));
  vec<int>::vec((vec<int> *)(in_RDI + 0xe));
  vec<LitFlags>::vec((vec<LitFlags> *)(in_RDI + 0x10));
  dVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::zero();
  in_RDI[0x12]._vptr_Branching = (_func_int **)dVar1.__r;
  vec<int>::vec((vec<int> *)(in_RDI + 0x14));
  vec<int>::vec((vec<int> *)(in_RDI + 0x16));
  uVar3 = (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  vec<vec<Lit>_>::vec(in_stack_fffffffffffffef0,uVar3);
  local_18 = 0;
  vec<int>::vec(in_stack_ffffffffffffff00,_sz,(int *)in_stack_fffffffffffffef0);
  vec<vec<Clause_*>_>::vec((vec<vec<Clause_*>_> *)in_stack_fffffffffffffef0,uVar3);
  in_RDI[0x1e]._vptr_Branching = (_func_int **)0x0;
  vec<Lit>::vec((vec<Lit> *)(in_RDI + 0x20));
  vec<int>::vec((vec<int> *)(in_RDI + 0x22));
  this_04 = (vec<char> *)(in_RDI + 0x24);
  vec<char>::vec(this_04);
  p.x = (int)((ulong)this_04 >> 0x20);
  r._pt = (Clause *)(in_RDI + 0x26);
  vec<bool>::vec((vec<bool> *)r._pt);
  this_03 = (SAT *)(in_RDI + 0x28);
  vec<int>::vec((vec<int> *)this_03);
  vec<Lit>::vec((vec<Lit> *)(in_RDI + 0x2a));
  this_02 = (Heap<SAT::VarOrderLt> *)(in_RDI + 0x2c);
  vec<Lit>::vec((vec<Lit> *)this_02);
  this_01 = (vec<IntVar_*> *)(in_RDI + 0x2e);
  vec<IntVar_*>::vec(this_01);
  in_RDI[0x33]._vptr_Branching = (_func_int **)0x3ff0000000000000;
  in_RDI[0x34]._vptr_Branching = (_func_int **)0x3ff0000000000000;
  this_00 = (vec<double> *)(in_RDI + 0x35);
  vec<double>::vec(this_00);
  VarOrderLt::VarOrderLt(&local_20,(vec<double> *)(in_RDI + 0x35));
  Heap<SAT::VarOrderLt>::Heap(this_02,(VarOrderLt *)this_01);
  uVar3 = (uint)((ulong)this_01 >> 0x20);
  vec<bool>::vec((vec<bool> *)(in_RDI + 0x3c));
  *(undefined4 *)&in_RDI[0x3e]._vptr_Branching = 0;
  *(undefined4 *)((long)&in_RDI[0x3e]._vptr_Branching + 4) = 0;
  *(undefined4 *)&in_RDI[0x3f]._vptr_Branching = 0;
  *(undefined4 *)((long)&in_RDI[0x3f]._vptr_Branching + 4) = 0;
  in_RDI[0x40]._vptr_Branching = (_func_int **)0x0;
  in_RDI[0x41]._vptr_Branching = (_func_int **)0x0;
  in_RDI[0x42]._vptr_Branching = (_func_int **)0x0;
  in_RDI[0x43]._vptr_Branching = (_func_int **)0x186a0;
  in_RDI[0x44]._vptr_Branching = (_func_int **)0x0;
  in_RDI[0x45]._vptr_Branching = (_func_int **)0x0;
  in_RDI[0x46]._vptr_Branching = (_func_int **)0x0;
  in_RDI[0x47]._vptr_Branching = (_func_int **)0x0;
  in_RDI[0x48]._vptr_Branching = (_func_int **)0x4059000000000000;
  in_RDI[0x49]._vptr_Branching = (_func_int **)0x408f400000000000;
  pp_Var2 = (_func_int **)std::chrono::_V2::steady_clock::now();
  in_RDI[0x4a]._vptr_Branching = pp_Var2;
  in_RDI[0x4b]._vptr_Branching = (_func_int **)0x3ff0000000000000;
  in_RDI[0x4c]._vptr_Branching = (_func_int **)0x4024000000000000;
  local_28 = (double)in_RDI[0x4c]._vptr_Branching * 1000.0 * 0.001953125;
  vec<double>::vec((vec<double> *)this_02,uVar3,(double *)this_00);
  local_30 = ::ci_null;
  newVar((SAT *)in_stack_ffffffffffffffa8._pt,n,in_stack_ffffffffffffffb0);
  Lit::Lit(&local_34,0,true);
  Reason::Reason(&local_40,(Clause *)0x0);
  enqueue(this_03,p,(Reason)r);
  newVar((SAT *)in_stack_ffffffffffffffa8._pt,n,in_stack_ffffffffffffffb0);
  Lit::Lit((Lit *)&stack0xffffffffffffffb4,1,false);
  Reason::Reason((Reason *)&stack0xffffffffffffffa8,(Clause *)0x0);
  enqueue(this_03,p,(Reason)r);
  pp_Var2 = (_func_int **)malloc(0x1000);
  in_RDI[0x30]._vptr_Branching = pp_Var2;
  pp_Var2 = (_func_int **)malloc(0x14);
  in_RDI[0x31]._vptr_Branching = pp_Var2;
  pp_Var2 = (_func_int **)malloc(0x10);
  in_RDI[0x32]._vptr_Branching = pp_Var2;
  Clause::clearFlags((Clause *)in_RDI[0x31]._vptr_Branching);
  Clause::clearFlags((Clause *)in_RDI[0x32]._vptr_Branching);
  *(uint *)in_RDI[0x32]._vptr_Branching = *(uint *)in_RDI[0x32]._vptr_Branching & 0xff | 0x200;
  return;
}

Assistant:

SAT::SAT()
		: lit_sort(trailpos),
			pushback_time(duration::zero()),
			trail(1),
			qhead(1, 0),
			rtrail(1),

			order_heap(VarOrderLt(activity)),

			ll_time(chuffed_clock::now()),

			learnt_len_occ(MAX_SHARE_LEN, learnt_len_el * 1000 / MAX_SHARE_LEN) {
	newVar();
	enqueue(Lit(0, true));
	newVar();
	enqueue(Lit(1, false));
	temp_sc = (SClause*)malloc(TEMP_SC_LEN * sizeof(int));
	short_expl = (Clause*)malloc(sizeof(Clause) + 3 * sizeof(Lit));
	short_confl = (Clause*)malloc(sizeof(Clause) + 2 * sizeof(Lit));
	short_expl->clearFlags();
	short_confl->clearFlags();
	short_confl->sz = 2;
}